

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O1

int __thiscall
MediaManager::GetType
          (MediaManager *this,
          vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *wanted_types)

{
  int iVar1;
  pointer ppIVar2;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  IMedia **it;
  pointer ppIVar10;
  int *piVar11;
  vector<MediaManager::MediaType,_std::allocator<MediaManager::MediaType>_> *__range2;
  
  ppIVar10 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppIVar2 = (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar10 == ppIVar2) {
    iVar9 = 0;
  }
  else {
    iVar8 = 0;
    iVar7 = 0;
    do {
      piVar3 = *(int **)(wanted_types + 8);
      iVar9 = 0;
      if (*(int **)wanted_types != piVar3) {
        iVar9 = 0;
        piVar5 = *(int **)wanted_types;
        do {
          piVar11 = piVar5 + 1;
          iVar1 = *piVar5;
          iVar6 = (**(*ppIVar10)->_vptr_IMedia)();
          if (iVar1 == iVar6) {
            iVar9 = *piVar5;
            break;
          }
          piVar5 = piVar11;
        } while (piVar11 != piVar3);
      }
      if (iVar9 == iVar8 || (iVar9 == 0 || iVar8 == 0)) {
        if (iVar9 == 3 && 1 < iVar7) {
          bVar4 = false;
        }
        else {
          iVar7 = iVar7 + 1;
          bVar4 = true;
          iVar8 = iVar9;
        }
      }
      else {
        bVar4 = false;
      }
      iVar9 = 0;
    } while ((bVar4) && (ppIVar10 = ppIVar10 + 1, iVar9 = iVar8, ppIVar10 != ppIVar2));
  }
  return iVar9;
}

Assistant:

int MediaManager::GetType(std::vector<MediaType> wanted_types)
{
   int result = MEDIA_UNDEF;
   int nb_media = 0;
   for (auto& it : media_list_)
   {
      // Maybe a use of Strategy pattern would do the job
      // RULES :
      // - Do not keep unwanted types
      int local_result = MEDIA_UNDEF;
      for (auto& wanted_type : wanted_types)
      {
         if (wanted_type == it->GetType())
         {
            local_result = wanted_type;
            break;
         }
      }
      // - No mixed types
      if (result != MEDIA_UNDEF && local_result != MEDIA_UNDEF && local_result != result)
      {
         return MEDIA_UNDEF;
      }
      // - No more than 2 DISK
      if (local_result == MEDIA_DISK && nb_media >= 2)
      {
         return MEDIA_UNDEF;
      }
      else
      {
         // - Unlimited number of tracks or ROM
         // - No more than 1 of any other
      }
      result = local_result;
      nb_media++;
   }
   return result;
}